

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uart_ping_pong.c
# Opt level: O0

void client_handle_write(cio_buffered_stream *buffered_stream,void *handler_context,cio_error err)

{
  cio_error cVar1;
  client *client;
  cio_error err_local;
  void *handler_context_local;
  cio_buffered_stream *buffered_stream_local;
  
  if (err == CIO_SUCCESS) {
    fprintf(_stdout,"Client wrote data, now receiving...\n");
    cio_read_buffer_consume((cio_read_buffer *)((long)handler_context + 0xe8),*handler_context);
    cVar1 = cio_buffered_stream_read_at_least
                      (buffered_stream,(cio_read_buffer *)((long)handler_context + 0xe8),6,
                       client_handle_read,handler_context);
    if (cVar1 != CIO_SUCCESS) {
      fprintf(_stderr,"server could no start reading!\n");
    }
  }
  else {
    fprintf(_stderr,"client failed to write!\n");
  }
  return;
}

Assistant:

static void client_handle_write(struct cio_buffered_stream *buffered_stream, void *handler_context, enum cio_error err)
{
	struct client *client = handler_context;

	if (cio_unlikely(err != CIO_SUCCESS)) {
		(void)fprintf(stderr, "client failed to write!\n");
		return;
	}

	(void)fprintf(stdout, "Client wrote data, now receiving...\n");

	cio_read_buffer_consume(&client->rb, client->bytes_read);

	err = cio_buffered_stream_read_at_least(buffered_stream, &client->rb, sizeof(HELLO), client_handle_read, client);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		(void)fprintf(stderr, "server could no start reading!\n");
		return;
	}
}